

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitSelect(PrintExpressionContents *this,Select *curr)

{
  bool bVar1;
  ostream *poVar2;
  Select *curr_local;
  PrintExpressionContents *this_local;
  
  poVar2 = prepareColor(this->o);
  std::operator<<(poVar2,"select");
  restoreNormalColor(this->o);
  bVar1 = wasm::Type::isRef(&(curr->super_SpecificExpression<(wasm::Expression::Id)17>).
                             super_Expression.type);
  if (bVar1) {
    std::operator<<(this->o,' ');
    printResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)17>).
                               super_Expression.type.id);
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    prepareColor(o) << "select";
    restoreNormalColor(o);
    if (curr->type.isRef()) {
      o << ' ';
      printResultType(curr->type);
    }
  }